

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_intrapred_sse2.c
# Opt level: O3

void aom_highbd_dc_left_predictor_16x32_sse2
               (uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,int bd)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [14];
  undefined1 auVar3 [14];
  uint uVar4;
  undefined1 auVar5 [14];
  unkbyte10 Var6;
  undefined1 auVar7 [14];
  undefined1 auVar8 [12];
  undefined8 uVar9;
  undefined1 auVar10 [12];
  int iVar11;
  uint16_t *puVar12;
  undefined4 uVar13;
  short sVar15;
  undefined1 auVar14 [16];
  short sVar17;
  short sVar18;
  undefined1 auVar16 [16];
  undefined1 auVar20 [16];
  short sVar23;
  short sVar24;
  short sVar25;
  undefined1 auVar22 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  short sVar19;
  short sVar21;
  short sVar26;
  short sVar29;
  
  auVar14 = *(undefined1 (*) [16])left;
  auVar16 = *(undefined1 (*) [16])(left + 8);
  auVar22 = *(undefined1 (*) [16])(left + 0x10);
  auVar1 = *(undefined1 (*) [16])(left + 0x18);
  sVar15 = auVar14._8_2_;
  auVar27._0_2_ = sVar15 + auVar14._0_2_;
  sVar17 = auVar14._10_2_;
  auVar27._2_2_ = sVar17 + auVar14._2_2_;
  sVar18 = auVar14._12_2_;
  auVar27._4_2_ = sVar18 + auVar14._4_2_;
  sVar19 = auVar14._14_2_;
  auVar27._6_2_ = sVar19 + auVar14._6_2_;
  auVar27._8_2_ = sVar15;
  auVar27._10_2_ = sVar17;
  auVar27._12_2_ = sVar18;
  auVar27._14_2_ = sVar19;
  auVar30 = pshuflw(in_XMM5,auVar27,0xe);
  auVar31._0_2_ = auVar30._0_2_ + auVar27._0_2_;
  auVar31._2_2_ = auVar30._2_2_ + auVar27._2_2_;
  auVar31._4_2_ = auVar30._4_2_ + auVar27._4_2_;
  auVar31._6_2_ = auVar30._6_2_ + auVar27._6_2_;
  auVar31._8_2_ = auVar30._8_2_ + sVar15;
  auVar31._10_2_ = auVar30._10_2_ + sVar17;
  auVar31._12_2_ = auVar30._12_2_ + sVar18;
  auVar31._14_2_ = auVar30._14_2_ + sVar19;
  auVar27 = pshuflw(auVar27,auVar31,1);
  sVar15 = auVar16._8_2_;
  auVar32._0_2_ = sVar15 + auVar16._0_2_;
  sVar17 = auVar16._10_2_;
  auVar32._2_2_ = sVar17 + auVar16._2_2_;
  sVar18 = auVar16._12_2_;
  auVar32._4_2_ = sVar18 + auVar16._4_2_;
  sVar19 = auVar16._14_2_;
  auVar32._6_2_ = sVar19 + auVar16._6_2_;
  auVar32._8_2_ = sVar15;
  auVar32._10_2_ = sVar17;
  auVar32._12_2_ = sVar18;
  auVar32._14_2_ = sVar19;
  auVar14 = pshuflw(auVar14,auVar32,0xe);
  auVar30._0_2_ = auVar14._0_2_ + auVar32._0_2_;
  auVar30._2_2_ = auVar14._2_2_ + auVar32._2_2_;
  auVar30._4_2_ = auVar14._4_2_ + auVar32._4_2_;
  auVar30._6_2_ = auVar14._6_2_ + auVar32._6_2_;
  auVar30._8_2_ = auVar14._8_2_ + sVar15;
  auVar30._10_2_ = auVar14._10_2_ + sVar17;
  auVar30._12_2_ = auVar14._12_2_ + sVar18;
  auVar30._14_2_ = auVar14._14_2_ + sVar19;
  auVar14 = pshuflw(auVar16,auVar30,1);
  sVar15 = auVar30._6_2_ + auVar31._6_2_ + auVar27._6_2_ + auVar14._6_2_;
  auVar8._2_2_ = auVar30._8_2_ + auVar31._8_2_ + auVar27._8_2_ + auVar14._8_2_;
  auVar8._0_2_ = sVar15;
  sVar19 = auVar22._8_2_;
  auVar20._0_2_ = sVar19 + auVar22._0_2_;
  sVar21 = auVar22._10_2_;
  auVar20._2_2_ = sVar21 + auVar22._2_2_;
  auVar20._4_2_ = auVar22._12_2_ + auVar22._4_2_;
  auVar20._6_2_ = auVar22._14_2_ + auVar22._6_2_;
  auVar20._8_2_ = sVar19;
  auVar20._10_2_ = sVar21;
  auVar20._12_2_ = auVar22._12_2_;
  auVar20._14_2_ = auVar22._14_2_;
  auVar22 = pshuflw(auVar22,auVar20,0xe);
  sVar23 = auVar22._2_2_ + auVar20._2_2_;
  sVar24 = auVar22._6_2_ + auVar20._6_2_;
  sVar26 = auVar1._8_2_;
  auVar28._0_2_ = sVar26 + auVar1._0_2_;
  sVar29 = auVar1._10_2_;
  auVar28._2_2_ = sVar29 + auVar1._2_2_;
  auVar28._4_2_ = auVar1._12_2_ + auVar1._4_2_;
  auVar28._6_2_ = auVar1._14_2_ + auVar1._6_2_;
  auVar28._8_2_ = sVar26;
  auVar28._10_2_ = sVar29;
  auVar28._12_2_ = auVar1._12_2_;
  auVar28._14_2_ = auVar1._14_2_;
  auVar16 = pshuflw(auVar1,auVar28,0xe);
  sVar17 = auVar16._2_2_ + auVar28._2_2_;
  sVar18 = auVar16._6_2_ + auVar28._6_2_;
  sVar25 = sVar24 + sVar18;
  auVar10._2_2_ =
       auVar22._8_2_ + sVar19 + auVar16._8_2_ + sVar26 + auVar22._10_2_ + sVar21 +
       auVar16._10_2_ + sVar29;
  auVar10._0_2_ = sVar25;
  auVar8._4_8_ = 0;
  auVar3._12_2_ = sVar15;
  auVar3._0_12_ = auVar8 << 0x30;
  uVar9 = CONCAT44(auVar3._10_4_,
                   CONCAT22(auVar30._4_2_ + auVar31._4_2_ + auVar27._4_2_ + auVar14._4_2_,sVar15));
  auVar5._6_8_ = 0;
  auVar5._0_6_ = (uint6)((ulong)uVar9 >> 0x10);
  Var6 = CONCAT82(SUB148(auVar5 << 0x40,6),
                  auVar30._2_2_ + auVar31._2_2_ + auVar27._2_2_ + auVar14._2_2_);
  uVar4 = CONCAT22(0,auVar30._0_2_ + auVar31._0_2_ + auVar27._0_2_ + auVar14._0_2_);
  auVar14._4_10_ = Var6;
  auVar14._0_4_ = uVar4;
  auVar14._14_2_ = 0;
  auVar10._4_8_ = 0;
  auVar2._12_2_ = sVar25;
  auVar2._0_12_ = auVar10 << 0x30;
  auVar7._6_8_ = 0;
  auVar7._0_6_ = (uint6)(CONCAT44(auVar2._10_4_,
                                  CONCAT22(auVar22._4_2_ + auVar20._4_2_ +
                                           auVar16._4_2_ + auVar28._4_2_ + sVar24 + sVar18,sVar25))
                        >> 0x10);
  auVar16._0_4_ =
       uVar4 + 0x10 +
       (uint)(ushort)(auVar22._0_2_ + auVar20._0_2_ + auVar16._0_2_ + auVar28._0_2_ + sVar23 +
                     sVar17) >> 5;
  auVar16._4_4_ = (uint)Var6 >> 5;
  auVar16._8_4_ =
       (uint)((int)((ulong)uVar9 >> 0x10) + (int)CONCAT82(SUB148(auVar7 << 0x40,6),sVar23 + sVar17))
       >> 5;
  auVar16._12_4_ = auVar3._10_4_ >> 0x15;
  auVar14 = pshuflw(auVar14,auVar16,0);
  uVar13 = auVar14._0_4_;
  puVar12 = dst + 8;
  iVar11 = 0x20;
  do {
    *(undefined4 *)(puVar12 + -8) = uVar13;
    *(undefined4 *)(puVar12 + -6) = uVar13;
    *(undefined4 *)(puVar12 + -4) = uVar13;
    *(undefined4 *)(puVar12 + -2) = uVar13;
    *(undefined4 *)puVar12 = uVar13;
    *(undefined4 *)(puVar12 + 2) = uVar13;
    *(undefined4 *)(puVar12 + 4) = uVar13;
    *(undefined4 *)(puVar12 + 6) = uVar13;
    puVar12 = puVar12 + stride;
    iVar11 = iVar11 + -1;
  } while (iVar11 != 0);
  return;
}

Assistant:

static inline __m128i dc_sum_32(const uint16_t *ref) {
  const __m128i zero = _mm_setzero_si128();
  const __m128i sum_a = dc_sum_16(ref);
  const __m128i sum_b = dc_sum_16(ref + 16);
  // 12 bit bd will outrange, so expand to 32 bit before adding final total
  return _mm_add_epi32(_mm_unpacklo_epi16(sum_a, zero),
                       _mm_unpacklo_epi16(sum_b, zero));
}